

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExceptModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  Location local_50;
  _Head_base<0UL,_wabt::ExceptionModuleField_*,_false> local_30;
  ExceptionModuleField *local_28;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    GetLocation(&local_50,this);
    MakeUnique<wabt::ExceptionModuleField,wabt::Location>((wabt *)&local_28,&local_50);
    RVar1 = Expect(this,Except);
    EVar2 = Error;
    if (RVar1.enum_ != Error) {
      ParseBindVarOpt(this,&(local_28->except).name);
      RVar1 = ParseValueTypeList(this,&(local_28->except).sig);
      if (RVar1.enum_ != Error) {
        RVar1 = Expect(this,Rpar);
        if (RVar1.enum_ != Error) {
          local_30._M_head_impl = local_28;
          local_28 = (ExceptionModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::ExceptionModuleField,_std::default_delete<wabt::ExceptionModuleField>_>
                                      *)&local_30);
          if (local_30._M_head_impl != (ExceptionModuleField *)0x0) {
            (*((local_30._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_30._M_head_impl = (ExceptionModuleField *)0x0;
          EVar2 = Ok;
        }
      }
    }
    if (local_28 != (ExceptionModuleField *)0x0) {
      (*(local_28->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField.
        _vptr_ModuleField[1])();
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseExceptModuleField(Module* module) {
  WABT_TRACE(ParseExceptModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<ExceptionModuleField>(GetLocation());
  EXPECT(Except);
  ParseBindVarOpt(&field->except.name);
  CHECK_RESULT(ParseValueTypeList(&field->except.sig));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}